

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O2

int h_scroll_value_2_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  int iVar4;
  Am_Object group;
  
  Am_Object::Get_Owner(&group,(Am_Slot_Flags)self);
  pAVar3 = Am_Object::Get(&group,0x18e,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(&group,0x1c1,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  iVar4 = 1;
  if (1 < iVar1 - iVar2) {
    iVar4 = iVar1 - iVar2;
  }
  Am_Object::~Am_Object(&group);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, h_scroll_value_2)
{
  Am_Object group = self.Get_Owner();
  int val = (int)group.Get(Am_INNER_WIDTH) - (int)group.Get(Am_CLIP_WIDTH);
  if (val < 1)
    val = 1;
  return val;
}